

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix_sparse.cpp
# Opt level: O0

void __thiscall test_matrix_sparse_find_Test::TestBody(test_matrix_sparse_find_Test *this)

{
  initializer_list<double> value;
  initializer_list<double> value_00;
  initializer_list<unsigned_long> index;
  initializer_list<unsigned_long> non_zero;
  initializer_list<unsigned_long> index_00;
  initializer_list<unsigned_long> non_zero_00;
  bool bVar1;
  char *pcVar2;
  size_t *psVar3;
  pointer this_00;
  AssertHelper local_d78;
  Message local_d70;
  value_type local_d68;
  Matrix_Sparse_Row<const_Disa::Matrix_Sparse> local_d58;
  iterator local_d48;
  size_t local_d28 [2];
  const_iterator_element local_d18;
  undefined1 local_cf8 [8];
  AssertionResult gtest_ar_25;
  Message local_ce0;
  size_t local_cd8;
  Matrix_Sparse_Row<const_Disa::Matrix_Sparse> local_cd0;
  iterator local_cc0;
  size_t local_ca0 [2];
  const_iterator_element local_c90;
  undefined1 local_c70 [8];
  AssertionResult gtest_ar_24;
  Message local_c58;
  size_t local_c50;
  Matrix_Sparse_Row<const_Disa::Matrix_Sparse> local_c48;
  iterator local_c38;
  size_t local_c18 [2];
  const_iterator_element local_c08;
  undefined1 local_be8 [8];
  AssertionResult gtest_ar_23;
  Message local_bd0;
  size_t local_bc8;
  Matrix_Sparse_Row<const_Disa::Matrix_Sparse> local_bc0;
  iterator local_bb0;
  size_t local_b90 [2];
  const_iterator_element local_b80;
  undefined1 local_b60 [8];
  AssertionResult gtest_ar_22;
  Message local_b48;
  int local_b3c;
  size_t local_b38 [2];
  const_iterator_element local_b28;
  undefined1 local_b08 [8];
  AssertionResult gtest_ar_21;
  Message local_af0;
  int local_ae4;
  size_t local_ae0 [2];
  const_iterator_element local_ad0;
  undefined1 local_ab0 [8];
  AssertionResult gtest_ar_20;
  Message local_a98;
  size_t local_a90;
  Matrix_Sparse_Row<const_Disa::Matrix_Sparse> local_a88;
  iterator local_a78;
  size_t local_a58 [2];
  const_iterator_element local_a48;
  undefined1 local_a28 [8];
  AssertionResult gtest_ar_19;
  Message local_a10;
  int local_a04;
  size_t local_a00 [2];
  const_iterator_element local_9f0;
  undefined1 local_9d0 [8];
  AssertionResult gtest_ar_18;
  Message local_9b8;
  int local_9ac;
  size_t local_9a8 [2];
  const_iterator_element local_998;
  undefined1 local_978 [8];
  AssertionResult gtest_ar_17;
  Message local_960;
  size_t local_958;
  Matrix_Sparse_Row<const_Disa::Matrix_Sparse> local_950;
  iterator local_940;
  size_t local_920 [2];
  const_iterator_element local_910;
  undefined1 local_8f0 [8];
  AssertionResult gtest_ar_16;
  Message local_8d8;
  int local_8cc;
  size_t local_8c8 [2];
  const_iterator_element local_8b8;
  undefined1 local_898 [8];
  AssertionResult gtest_ar_15;
  Message local_880;
  int local_874;
  size_t local_870 [2];
  const_iterator_element local_860;
  undefined1 local_840 [8];
  AssertionResult gtest_ar_14;
  Message local_828;
  size_t local_820;
  Matrix_Sparse_Row<const_Disa::Matrix_Sparse> local_818;
  iterator local_808;
  size_t local_7e8 [2];
  const_iterator_element local_7d8;
  undefined1 local_7b8 [8];
  AssertionResult gtest_ar_13;
  unsigned_long local_778 [4];
  iterator local_758;
  undefined8 local_750;
  unsigned_long local_748 [4];
  iterator local_728;
  undefined8 local_720;
  undefined1 local_718 [8];
  Matrix_Sparse matrix_const;
  Message local_6c0;
  undefined1 local_6b8 [48];
  pointer local_688;
  pointer local_680;
  iterator_element local_678;
  undefined1 local_658 [8];
  AssertionResult gtest_ar_12;
  Message local_640;
  undefined8 local_638;
  undefined1 local_630 [48];
  pointer local_600;
  pointer local_5f8;
  iterator_element local_5f0;
  undefined1 local_5d0 [8];
  AssertionResult gtest_ar_11;
  Message local_5b8;
  undefined8 local_5b0;
  undefined1 local_5a8 [48];
  pointer local_578;
  pointer local_570;
  iterator_element local_568;
  undefined1 local_548 [8];
  AssertionResult gtest_ar_10;
  Message local_530;
  undefined8 local_528;
  undefined1 local_520 [48];
  pointer local_4f0;
  pointer local_4e8;
  iterator_element local_4e0;
  undefined1 local_4c0 [8];
  AssertionResult gtest_ar_9;
  Message local_4a8;
  int local_49c;
  size_t local_498 [2];
  iterator_element local_488;
  undefined1 local_468 [8];
  AssertionResult gtest_ar_8;
  Message local_450;
  int local_444;
  size_t local_440 [2];
  iterator_element local_430;
  undefined1 local_410 [8];
  AssertionResult gtest_ar_7;
  Message local_3f8;
  undefined8 local_3f0;
  undefined1 local_3e8 [48];
  pointer local_3b8;
  pointer local_3b0;
  iterator_element local_3a8;
  undefined1 local_388 [8];
  AssertionResult gtest_ar_6;
  Message local_370;
  int local_364;
  size_t local_360 [2];
  iterator_element local_350;
  undefined1 local_330 [8];
  AssertionResult gtest_ar_5;
  Message local_318;
  int local_30c;
  size_t local_308 [2];
  iterator_element local_2f8;
  undefined1 local_2d8 [8];
  AssertionResult gtest_ar_4;
  Message local_2c0;
  undefined8 local_2b8;
  undefined1 local_2b0 [48];
  pointer local_280;
  pointer local_278;
  iterator_element local_270;
  undefined1 local_250 [8];
  AssertionResult gtest_ar_3;
  Message local_238;
  int local_22c;
  size_t local_228 [2];
  iterator_element local_218;
  undefined1 local_1f8 [8];
  AssertionResult gtest_ar_2;
  Message local_1e0;
  int local_1d4;
  size_t local_1d0 [2];
  iterator_element local_1c0;
  undefined1 local_1a0 [8];
  AssertionResult gtest_ar_1;
  Message local_188;
  undefined8 local_180;
  undefined1 local_178 [64];
  pointer local_138;
  size_t local_130;
  iterator_element local_128;
  undefined1 local_108 [8];
  AssertionResult gtest_ar;
  unsigned_long local_c8 [4];
  iterator local_a8;
  undefined8 local_a0;
  unsigned_long local_98 [5];
  iterator local_70;
  undefined8 local_68;
  undefined1 local_60 [8];
  Matrix_Sparse matrix;
  test_matrix_sparse_find_Test *this_local;
  
  local_98[2] = 3;
  local_98[3] = 3;
  local_98[0] = 0;
  local_98[1] = 1;
  local_70 = local_98;
  local_68 = 4;
  local_c8[0] = 1;
  local_c8[1] = 0;
  local_c8[2] = 2;
  local_a8 = local_c8;
  local_a0 = 3;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x4008000000000000;
  non_zero_00._M_len = 4;
  non_zero_00._M_array = local_70;
  index_00._M_len = 3;
  index_00._M_array = local_a8;
  value._M_len = 3;
  value._M_array = (iterator)&gtest_ar.message_;
  matrix.column_size = (size_t)this;
  Disa::Matrix_Sparse::Matrix_Sparse((Matrix_Sparse *)local_60,non_zero_00,index_00,value,3);
  local_130 = 0;
  local_138 = (pointer)0x0;
  Disa::Matrix_Sparse::find(&local_128,(Matrix_Sparse *)local_60,&local_130,(size_t *)&local_138);
  local_180 = 0;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_178,(size_t *)local_60);
  Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::end
            ((iterator *)(local_178 + 0x10),(Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_178);
  testing::internal::EqHelper::
  Compare<Disa::Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>,_Disa::Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>,_nullptr>
            ((EqHelper *)local_108,"matrix.find(0, 0)","matrix[0].end()",&local_128,
             (Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse> *)(local_178 + 0x10));
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_108);
  if (!bVar1) {
    testing::Message::Message(&local_188);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_108);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x1b2,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_188);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_188);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_108);
  local_1d0[1] = 0;
  local_1d0[0] = 1;
  Disa::Matrix_Sparse::find(&local_1c0,(Matrix_Sparse *)local_60,local_1d0 + 1,local_1d0);
  psVar3 = Disa::Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>::i_row(&local_1c0);
  local_1d4 = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_1a0,"matrix.find(0, 1).i_row()","0",psVar3,&local_1d4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a0);
  if (!bVar1) {
    testing::Message::Message(&local_1e0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x1b3,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_1e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_1e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a0);
  local_228[1] = 0;
  local_228[0] = 1;
  Disa::Matrix_Sparse::find(&local_218,(Matrix_Sparse *)local_60,local_228 + 1,local_228);
  psVar3 = Disa::Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>::i_column(&local_218);
  local_22c = 1;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_1f8,"matrix.find(0, 1).i_column()","1",psVar3,&local_22c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f8);
  if (!bVar1) {
    testing::Message::Message(&local_238);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x1b4,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_238);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_238);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f8);
  local_278 = (pointer)0x0;
  local_280 = (pointer)0x2;
  Disa::Matrix_Sparse::find
            (&local_270,(Matrix_Sparse *)local_60,(size_t *)&local_278,(size_t *)&local_280);
  local_2b8 = 0;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_2b0,(size_t *)local_60);
  Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::end
            ((iterator *)(local_2b0 + 0x10),(Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_2b0);
  testing::internal::EqHelper::
  Compare<Disa::Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>,_Disa::Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>,_nullptr>
            ((EqHelper *)local_250,"matrix.find(0, 2)","matrix[0].end()",&local_270,
             (Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse> *)(local_2b0 + 0x10));
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_250);
  if (!bVar1) {
    testing::Message::Message(&local_2c0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_250);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x1b5,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_2c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_2c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_250);
  local_308[1] = 1;
  local_308[0] = 0;
  Disa::Matrix_Sparse::find(&local_2f8,(Matrix_Sparse *)local_60,local_308 + 1,local_308);
  psVar3 = Disa::Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>::i_row(&local_2f8);
  local_30c = 1;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_2d8,"matrix.find(1, 0).i_row()","1",psVar3,&local_30c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2d8);
  if (!bVar1) {
    testing::Message::Message(&local_318);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x1b7,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_318);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_318);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d8);
  local_360[1] = 1;
  local_360[0] = 0;
  Disa::Matrix_Sparse::find(&local_350,(Matrix_Sparse *)local_60,local_360 + 1,local_360);
  psVar3 = Disa::Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>::i_column(&local_350);
  local_364 = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_330,"matrix.find(1, 0).i_column()","0",psVar3,&local_364);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_330);
  if (!bVar1) {
    testing::Message::Message(&local_370);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_330);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x1b8,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_370);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_370);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_330);
  local_3b0 = (pointer)0x1;
  local_3b8 = (pointer)0x1;
  Disa::Matrix_Sparse::find
            (&local_3a8,(Matrix_Sparse *)local_60,(size_t *)&local_3b0,(size_t *)&local_3b8);
  local_3f0 = 1;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_3e8,(size_t *)local_60);
  Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::end
            ((iterator *)(local_3e8 + 0x10),(Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_3e8);
  testing::internal::EqHelper::
  Compare<Disa::Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>,_Disa::Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>,_nullptr>
            ((EqHelper *)local_388,"matrix.find(1, 1)","matrix[1].end()",&local_3a8,
             (Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse> *)(local_3e8 + 0x10));
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_388);
  if (!bVar1) {
    testing::Message::Message(&local_3f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_388);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x1b9,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_3f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_3f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_388);
  local_440[1] = 1;
  local_440[0] = 2;
  Disa::Matrix_Sparse::find(&local_430,(Matrix_Sparse *)local_60,local_440 + 1,local_440);
  psVar3 = Disa::Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>::i_row(&local_430);
  local_444 = 1;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_410,"matrix.find(1, 2).i_row()","1",psVar3,&local_444);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_410);
  if (!bVar1) {
    testing::Message::Message(&local_450);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_410);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x1ba,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_450);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_450);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_410);
  local_498[1] = 1;
  local_498[0] = 2;
  Disa::Matrix_Sparse::find(&local_488,(Matrix_Sparse *)local_60,local_498 + 1,local_498);
  psVar3 = Disa::Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>::i_column(&local_488);
  local_49c = 2;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_468,"matrix.find(1, 2).i_column()","2",psVar3,&local_49c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_468);
  if (!bVar1) {
    testing::Message::Message(&local_4a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_468);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x1bb,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_4a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_4a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_468);
  local_4e8 = (pointer)0x2;
  local_4f0 = (pointer)0x1;
  Disa::Matrix_Sparse::find
            (&local_4e0,(Matrix_Sparse *)local_60,(size_t *)&local_4e8,(size_t *)&local_4f0);
  local_528 = 2;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_520,(size_t *)local_60);
  Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::end
            ((iterator *)(local_520 + 0x10),(Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_520);
  testing::internal::EqHelper::
  Compare<Disa::Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>,_Disa::Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>,_nullptr>
            ((EqHelper *)local_4c0,"matrix.find(2, 1)","matrix[2].end()",&local_4e0,
             (Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse> *)(local_520 + 0x10));
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4c0);
  if (!bVar1) {
    testing::Message::Message(&local_530);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x1bd,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_530);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_530);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4c0);
  local_570 = (pointer)0x2;
  local_578 = (pointer)0x2;
  Disa::Matrix_Sparse::find
            (&local_568,(Matrix_Sparse *)local_60,(size_t *)&local_570,(size_t *)&local_578);
  local_5b0 = 2;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_5a8,(size_t *)local_60);
  Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::end
            ((iterator *)(local_5a8 + 0x10),(Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_5a8);
  testing::internal::EqHelper::
  Compare<Disa::Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>,_Disa::Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>,_nullptr>
            ((EqHelper *)local_548,"matrix.find(2, 2)","matrix[2].end()",&local_568,
             (Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse> *)(local_5a8 + 0x10));
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_548);
  if (!bVar1) {
    testing::Message::Message(&local_5b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_548);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x1be,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_5b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_5b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_548);
  local_5f8 = (pointer)0x2;
  local_600 = (pointer)0x3;
  Disa::Matrix_Sparse::find
            (&local_5f0,(Matrix_Sparse *)local_60,(size_t *)&local_5f8,(size_t *)&local_600);
  local_638 = 2;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_630,(size_t *)local_60);
  Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::end
            ((iterator *)(local_630 + 0x10),(Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_630);
  testing::internal::EqHelper::
  Compare<Disa::Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>,_Disa::Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>,_nullptr>
            ((EqHelper *)local_5d0,"matrix.find(2, 3)","matrix[2].end()",&local_5f0,
             (Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse> *)(local_630 + 0x10));
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5d0);
  if (!bVar1) {
    testing::Message::Message(&local_640);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_5d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x1bf,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_12.message_,&local_640);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
    testing::Message::~Message(&local_640);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5d0);
  local_680 = (pointer)0x3;
  local_688 = (pointer)0x3;
  Disa::Matrix_Sparse::find
            (&local_678,(Matrix_Sparse *)local_60,(size_t *)&local_680,(size_t *)&local_688);
  Disa::Matrix_Sparse::end((Matrix_Sparse *)local_6b8);
  this_00 = Disa::Iterator_Matrix_Sparse_Row<Disa::Matrix_Sparse>::
            operator-><Disa::Matrix_Sparse,_true>
                      ((Iterator_Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_6b8);
  Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::end((iterator *)(local_6b8 + 0x10),this_00);
  testing::internal::EqHelper::
  Compare<Disa::Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>,_Disa::Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>,_nullptr>
            ((EqHelper *)local_658,"matrix.find(3, 3)","matrix.end()->end()",&local_678,
             (Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse> *)(local_6b8 + 0x10));
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_658);
  if (!bVar1) {
    testing::Message::Message(&local_6c0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_658);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&matrix_const.column_size,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x1c0,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&matrix_const.column_size,&local_6c0)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&matrix_const.column_size);
    testing::Message::~Message(&local_6c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_658);
  local_748[2] = 3;
  local_748[3] = 3;
  local_748[0] = 0;
  local_748[1] = 1;
  local_728 = local_748;
  local_720 = 4;
  local_778[0] = 1;
  local_778[1] = 0;
  local_778[2] = 2;
  local_758 = local_778;
  local_750 = 3;
  gtest_ar_13.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x4008000000000000;
  non_zero._M_len = 4;
  non_zero._M_array = local_728;
  index._M_len = 3;
  index._M_array = local_758;
  value_00._M_len = 3;
  value_00._M_array = (iterator)&gtest_ar_13.message_;
  Disa::Matrix_Sparse::Matrix_Sparse((Matrix_Sparse *)local_718,non_zero,index,value_00,3);
  local_7e8[1] = 0;
  local_7e8[0] = 0;
  Disa::Matrix_Sparse::find(&local_7d8,(Matrix_Sparse *)local_718,local_7e8 + 1,local_7e8);
  local_820 = 0;
  local_818 = Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_718,&local_820);
  Disa::Matrix_Sparse_Row<const_Disa::Matrix_Sparse>::end(&local_808,&local_818);
  testing::internal::EqHelper::
  Compare<Disa::Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse>,_Disa::Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse>,_nullptr>
            ((EqHelper *)local_7b8,"matrix_const.find(0, 0)","matrix_const[0].end()",&local_7d8,
             &local_808);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7b8);
  if (!bVar1) {
    testing::Message::Message(&local_828);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_7b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x1c3,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_14.message_,&local_828);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
    testing::Message::~Message(&local_828);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7b8);
  local_870[1] = 0;
  local_870[0] = 1;
  Disa::Matrix_Sparse::find(&local_860,(Matrix_Sparse *)local_718,local_870 + 1,local_870);
  psVar3 = Disa::Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse>::i_row(&local_860);
  local_874 = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_840,"matrix_const.find(0, 1).i_row()","0",psVar3,&local_874);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_840);
  if (!bVar1) {
    testing::Message::Message(&local_880);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_840);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_15.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x1c4,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_15.message_,&local_880);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15.message_);
    testing::Message::~Message(&local_880);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_840);
  local_8c8[1] = 0;
  local_8c8[0] = 1;
  Disa::Matrix_Sparse::find(&local_8b8,(Matrix_Sparse *)local_718,local_8c8 + 1,local_8c8);
  psVar3 = Disa::Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse>::i_column(&local_8b8);
  local_8cc = 1;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_898,"matrix_const.find(0, 1).i_column()","1",psVar3,&local_8cc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_898);
  if (!bVar1) {
    testing::Message::Message(&local_8d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_898);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_16.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x1c5,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_16.message_,&local_8d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_16.message_);
    testing::Message::~Message(&local_8d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_898);
  local_920[1] = 0;
  local_920[0] = 2;
  Disa::Matrix_Sparse::find(&local_910,(Matrix_Sparse *)local_718,local_920 + 1,local_920);
  local_958 = 0;
  local_950 = Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_718,&local_958);
  Disa::Matrix_Sparse_Row<const_Disa::Matrix_Sparse>::end(&local_940,&local_950);
  testing::internal::EqHelper::
  Compare<Disa::Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse>,_Disa::Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse>,_nullptr>
            ((EqHelper *)local_8f0,"matrix_const.find(0, 2)","matrix_const[0].end()",&local_910,
             &local_940);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8f0);
  if (!bVar1) {
    testing::Message::Message(&local_960);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_8f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_17.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x1c6,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_17.message_,&local_960);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17.message_);
    testing::Message::~Message(&local_960);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8f0);
  local_9a8[1] = 1;
  local_9a8[0] = 0;
  Disa::Matrix_Sparse::find(&local_998,(Matrix_Sparse *)local_718,local_9a8 + 1,local_9a8);
  psVar3 = Disa::Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse>::i_row(&local_998);
  local_9ac = 1;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_978,"matrix_const.find(1, 0).i_row()","1",psVar3,&local_9ac);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_978);
  if (!bVar1) {
    testing::Message::Message(&local_9b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_978);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_18.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x1c8,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_18.message_,&local_9b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_18.message_);
    testing::Message::~Message(&local_9b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_978);
  local_a00[1] = 1;
  local_a00[0] = 0;
  Disa::Matrix_Sparse::find(&local_9f0,(Matrix_Sparse *)local_718,local_a00 + 1,local_a00);
  psVar3 = Disa::Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse>::i_column(&local_9f0);
  local_a04 = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_9d0,"matrix_const.find(1, 0).i_column()","0",psVar3,&local_a04);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9d0);
  if (!bVar1) {
    testing::Message::Message(&local_a10);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_9d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_19.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x1c9,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_19.message_,&local_a10);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_19.message_);
    testing::Message::~Message(&local_a10);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_9d0);
  local_a58[1] = 1;
  local_a58[0] = 1;
  Disa::Matrix_Sparse::find(&local_a48,(Matrix_Sparse *)local_718,local_a58 + 1,local_a58);
  local_a90 = 1;
  local_a88 = Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_718,&local_a90);
  Disa::Matrix_Sparse_Row<const_Disa::Matrix_Sparse>::end(&local_a78,&local_a88);
  testing::internal::EqHelper::
  Compare<Disa::Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse>,_Disa::Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse>,_nullptr>
            ((EqHelper *)local_a28,"matrix_const.find(1, 1)","matrix_const[1].end()",&local_a48,
             &local_a78);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a28);
  if (!bVar1) {
    testing::Message::Message(&local_a98);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a28);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_20.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x1ca,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_20.message_,&local_a98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_20.message_);
    testing::Message::~Message(&local_a98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a28);
  local_ae0[1] = 1;
  local_ae0[0] = 2;
  Disa::Matrix_Sparse::find(&local_ad0,(Matrix_Sparse *)local_718,local_ae0 + 1,local_ae0);
  psVar3 = Disa::Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse>::i_row(&local_ad0);
  local_ae4 = 1;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_ab0,"matrix_const.find(1, 2).i_row()","1",psVar3,&local_ae4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ab0);
  if (!bVar1) {
    testing::Message::Message(&local_af0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_ab0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_21.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x1cb,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_21.message_,&local_af0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_21.message_);
    testing::Message::~Message(&local_af0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ab0);
  local_b38[1] = 1;
  local_b38[0] = 2;
  Disa::Matrix_Sparse::find(&local_b28,(Matrix_Sparse *)local_718,local_b38 + 1,local_b38);
  psVar3 = Disa::Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse>::i_column(&local_b28);
  local_b3c = 2;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_b08,"matrix_const.find(1, 2).i_column()","2",psVar3,&local_b3c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b08);
  if (!bVar1) {
    testing::Message::Message(&local_b48);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b08);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_22.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x1cc,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_22.message_,&local_b48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_22.message_);
    testing::Message::~Message(&local_b48);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b08);
  local_b90[1] = 2;
  local_b90[0] = 1;
  Disa::Matrix_Sparse::find(&local_b80,(Matrix_Sparse *)local_718,local_b90 + 1,local_b90);
  local_bc8 = 2;
  local_bc0 = Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_718,&local_bc8);
  Disa::Matrix_Sparse_Row<const_Disa::Matrix_Sparse>::end(&local_bb0,&local_bc0);
  testing::internal::EqHelper::
  Compare<Disa::Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse>,_Disa::Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse>,_nullptr>
            ((EqHelper *)local_b60,"matrix_const.find(2, 1)","matrix_const[2].end()",&local_b80,
             &local_bb0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b60);
  if (!bVar1) {
    testing::Message::Message(&local_bd0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b60);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_23.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x1ce,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_23.message_,&local_bd0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_23.message_);
    testing::Message::~Message(&local_bd0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b60);
  local_c18[1] = 2;
  local_c18[0] = 2;
  Disa::Matrix_Sparse::find(&local_c08,(Matrix_Sparse *)local_718,local_c18 + 1,local_c18);
  local_c50 = 2;
  local_c48 = Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_718,&local_c50);
  Disa::Matrix_Sparse_Row<const_Disa::Matrix_Sparse>::end(&local_c38,&local_c48);
  testing::internal::EqHelper::
  Compare<Disa::Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse>,_Disa::Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse>,_nullptr>
            ((EqHelper *)local_be8,"matrix_const.find(2, 2)","matrix_const[2].end()",&local_c08,
             &local_c38);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_be8);
  if (!bVar1) {
    testing::Message::Message(&local_c58);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_be8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_24.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x1cf,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_24.message_,&local_c58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_24.message_);
    testing::Message::~Message(&local_c58);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_be8);
  local_ca0[1] = 2;
  local_ca0[0] = 3;
  Disa::Matrix_Sparse::find(&local_c90,(Matrix_Sparse *)local_718,local_ca0 + 1,local_ca0);
  local_cd8 = 2;
  local_cd0 = Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_718,&local_cd8);
  Disa::Matrix_Sparse_Row<const_Disa::Matrix_Sparse>::end(&local_cc0,&local_cd0);
  testing::internal::EqHelper::
  Compare<Disa::Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse>,_Disa::Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse>,_nullptr>
            ((EqHelper *)local_c70,"matrix_const.find(2, 3)","matrix_const[2].end()",&local_c90,
             &local_cc0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c70);
  if (!bVar1) {
    testing::Message::Message(&local_ce0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c70);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_25.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x1d0,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_25.message_,&local_ce0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_25.message_);
    testing::Message::~Message(&local_ce0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c70);
  local_d28[1] = 3;
  local_d28[0] = 3;
  Disa::Matrix_Sparse::find(&local_d18,(Matrix_Sparse *)local_718,local_d28 + 1,local_d28);
  local_d68 = (value_type)Disa::Matrix_Sparse::end((Matrix_Sparse *)local_718);
  local_d58 = Disa::Iterator_Matrix_Sparse_Row<const_Disa::Matrix_Sparse>::operator*
                        ((Iterator_Matrix_Sparse_Row<const_Disa::Matrix_Sparse> *)&local_d68);
  Disa::Matrix_Sparse_Row<const_Disa::Matrix_Sparse>::end(&local_d48,&local_d58);
  testing::internal::EqHelper::
  Compare<Disa::Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse>,_Disa::Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse>,_nullptr>
            ((EqHelper *)local_cf8,"matrix_const.find(3, 3)","(*matrix_const.end()).end()",
             &local_d18,&local_d48);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_cf8);
  if (!bVar1) {
    testing::Message::Message(&local_d70);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_cf8);
    testing::internal::AssertHelper::AssertHelper
              (&local_d78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x1d1,pcVar2);
    testing::internal::AssertHelper::operator=(&local_d78,&local_d70);
    testing::internal::AssertHelper::~AssertHelper(&local_d78);
    testing::Message::~Message(&local_d70);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_cf8);
  Disa::Matrix_Sparse::~Matrix_Sparse((Matrix_Sparse *)local_718);
  Disa::Matrix_Sparse::~Matrix_Sparse((Matrix_Sparse *)local_60);
  return;
}

Assistant:

TEST(test_matrix_sparse, find) {
  Matrix_Sparse matrix({0, 1, 3, 3}, {1, 0, 2}, {3.0, 4.0, 5.0}, 3);
  EXPECT_EQ(matrix.find(0, 0), matrix[0].end());
  EXPECT_EQ(matrix.find(0, 1).i_row(), 0);
  EXPECT_EQ(matrix.find(0, 1).i_column(), 1);
  EXPECT_EQ(matrix.find(0, 2), matrix[0].end());

  EXPECT_EQ(matrix.find(1, 0).i_row(), 1);
  EXPECT_EQ(matrix.find(1, 0).i_column(), 0);
  EXPECT_EQ(matrix.find(1, 1), matrix[1].end());
  EXPECT_EQ(matrix.find(1, 2).i_row(), 1);
  EXPECT_EQ(matrix.find(1, 2).i_column(), 2);

  EXPECT_EQ(matrix.find(2, 1), matrix[2].end());
  EXPECT_EQ(matrix.find(2, 2), matrix[2].end());
  EXPECT_EQ(matrix.find(2, 3), matrix[2].end());
  EXPECT_EQ(matrix.find(3, 3), matrix.end()->end());

  const Matrix_Sparse matrix_const({0, 1, 3, 3}, {1, 0, 2}, {3.0, 4.0, 5.0}, 3);
  EXPECT_EQ(matrix_const.find(0, 0), matrix_const[0].end());
  EXPECT_EQ(matrix_const.find(0, 1).i_row(), 0);
  EXPECT_EQ(matrix_const.find(0, 1).i_column(), 1);
  EXPECT_EQ(matrix_const.find(0, 2), matrix_const[0].end());

  EXPECT_EQ(matrix_const.find(1, 0).i_row(), 1);
  EXPECT_EQ(matrix_const.find(1, 0).i_column(), 0);
  EXPECT_EQ(matrix_const.find(1, 1), matrix_const[1].end());
  EXPECT_EQ(matrix_const.find(1, 2).i_row(), 1);
  EXPECT_EQ(matrix_const.find(1, 2).i_column(), 2);

  EXPECT_EQ(matrix_const.find(2, 1), matrix_const[2].end());
  EXPECT_EQ(matrix_const.find(2, 2), matrix_const[2].end());
  EXPECT_EQ(matrix_const.find(2, 3), matrix_const[2].end());
  EXPECT_EQ(matrix_const.find(3, 3), (*matrix_const.end()).end());
}